

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

GPU_Image * GPU_CopyImageFromTarget(GPU_Target *target)

{
  GPU_Target *pGVar1;
  GPU_Image *pGVar2;
  
  if (_gpu_current_renderer != (GPU_Renderer *)0x0) {
    pGVar1 = _gpu_current_renderer->current_context_target;
    if (target != (GPU_Target *)0x0 && pGVar1 == (GPU_Target *)0x0) {
      if (target->context == (GPU_Context *)0x0) {
        return (GPU_Image *)0x0;
      }
      GPU_MakeCurrent(target,target->context->windowID);
      pGVar1 = _gpu_current_renderer->current_context_target;
    }
    if (pGVar1 != (GPU_Target *)0x0) {
      pGVar2 = (*_gpu_current_renderer->impl->CopyImageFromTarget)(_gpu_current_renderer,target);
      return pGVar2;
    }
  }
  return (GPU_Image *)0x0;
}

Assistant:

GPU_Image* GPU_CopyImageFromTarget(GPU_Target* target)
{
    if(_gpu_current_renderer == NULL)
        return NULL;
    MAKE_CURRENT_IF_NONE(target);
    if(_gpu_current_renderer->current_context_target == NULL)
        return NULL;

    return _gpu_current_renderer->impl->CopyImageFromTarget(_gpu_current_renderer, target);
}